

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_echo.c
# Opt level: O0

int main(void)

{
  cio_address_family family;
  __sighandler_t p_Var1;
  cio_inet_address *inet_address;
  undefined1 local_e8 [8];
  cio_server_socket server_socket;
  cio_error err;
  cio_socket_address endpoint;
  int ret;
  
  p_Var1 = signal(0xf,sighandler);
  if (p_Var1 == (__sighandler_t)0xffffffffffffffff) {
    endpoint.impl.sa._108_4_ = 0xffffffff;
  }
  else {
    p_Var1 = signal(2,sighandler);
    if (p_Var1 == (__sighandler_t)0xffffffffffffffff) {
      signal(0xf,(__sighandler_t)0x0);
      endpoint.impl.sa._108_4_ = 0xffffffff;
    }
    else {
      inet_address = cio_get_inet_address_any4();
      server_socket.free_client._0_4_ =
           cio_init_inet_socket_address
                     ((cio_socket_address *)((long)&server_socket.free_client + 4),inet_address,
                      0x3039);
      if ((cio_error)server_socket.free_client == CIO_SUCCESS) {
        server_socket.free_client._0_4_ = cio_eventloop_init(&loop);
        if ((cio_error)server_socket.free_client == CIO_SUCCESS) {
          family = cio_socket_address_get_family
                             ((cio_socket_address *)((long)&server_socket.free_client + 4));
          server_socket.free_client._0_4_ =
               cio_server_socket_init
                         ((cio_server_socket *)local_e8,&loop,5,family,alloc_echo_client,
                          free_echo_client,1000000000,(cio_server_socket_close_hook_t)0x0);
          if ((cio_error)server_socket.free_client == CIO_SUCCESS) {
            server_socket.free_client._0_4_ =
                 cio_server_socket_set_tcp_fast_open((cio_server_socket *)local_e8,true);
            if ((cio_error)server_socket.free_client == CIO_SUCCESS) {
              server_socket.free_client._0_4_ =
                   cio_server_socket_set_reuse_address((cio_server_socket *)local_e8,true);
              if ((cio_error)server_socket.free_client == CIO_SUCCESS) {
                server_socket.free_client._0_4_ =
                     cio_server_socket_bind
                               ((cio_server_socket *)local_e8,
                                (cio_socket_address *)((long)&server_socket.free_client + 4));
                if ((cio_error)server_socket.free_client == CIO_SUCCESS) {
                  server_socket.free_client._0_4_ =
                       cio_server_socket_accept
                                 ((cio_server_socket *)local_e8,handle_accept,(void *)0x0);
                  if ((cio_error)server_socket.free_client == CIO_SUCCESS) {
                    server_socket.free_client._0_4_ = cio_eventloop_run(&loop);
                    endpoint.impl.sa._105_3_ = 0;
                    endpoint.impl.sa.unix_address.un.sun_path[0x66] =
                         (cio_error)server_socket.free_client != CIO_SUCCESS;
                  }
                  else {
                    endpoint.impl.sa._104_4_ = 1;
                  }
                }
                else {
                  endpoint.impl.sa._104_4_ = 1;
                }
              }
              else {
                endpoint.impl.sa._104_4_ = 1;
              }
            }
            else {
              fprintf(_stderr,"could not set TCP FASTOPEN for server socket!\n");
              endpoint.impl.sa._104_4_ = 1;
            }
            cio_server_socket_close((cio_server_socket *)local_e8);
          }
          else {
            endpoint.impl.sa._104_4_ = 1;
          }
          cio_eventloop_destroy(&loop);
          endpoint.impl.sa._108_4_ = endpoint.impl.sa._104_4_;
        }
        else {
          endpoint.impl.sa._108_4_ = 1;
        }
      }
      else {
        endpoint.impl.sa._108_4_ = 0xffffffff;
      }
    }
  }
  return endpoint.impl.sa._108_4_;
}

Assistant:

int main(void)
{
	int ret = EXIT_SUCCESS;
	if (signal(SIGTERM, sighandler) == SIG_ERR) {
		return -1;
	}

	if (signal(SIGINT, sighandler) == SIG_ERR) {
		(void)signal(SIGTERM, SIG_DFL);
		return -1;
	}

	struct cio_socket_address endpoint;
	enum cio_error err = cio_init_inet_socket_address(&endpoint, cio_get_inet_address_any4(), SERVERSOCKET_LISTEN_PORT);
	if (err != CIO_SUCCESS) {
		return -1;
	}

	err = cio_eventloop_init(&loop);
	if (err != CIO_SUCCESS) {
		return EXIT_FAILURE;
	}

	struct cio_server_socket server_socket;
	err = cio_server_socket_init(&server_socket, &loop, SERVERSOCKET_BACKLOG, cio_socket_address_get_family(&endpoint), alloc_echo_client, free_echo_client, CLOSE_TIMEOUT_NS, NULL);
	if (err != CIO_SUCCESS) {
		ret = EXIT_FAILURE;
		goto destroy_loop;
	}

	err = cio_server_socket_set_tcp_fast_open(&server_socket, true);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "could not set TCP FASTOPEN for server socket!\n");
		ret = EXIT_FAILURE;
		goto close_socket;
	}

	err = cio_server_socket_set_reuse_address(&server_socket, true);
	if (err != CIO_SUCCESS) {
		ret = EXIT_FAILURE;
		goto close_socket;
	}

	err = cio_server_socket_bind(&server_socket, &endpoint);
	if (err != CIO_SUCCESS) {
		ret = EXIT_FAILURE;
		goto close_socket;
	}

	err = cio_server_socket_accept(&server_socket, handle_accept, NULL);
	if (err != CIO_SUCCESS) {
		ret = EXIT_FAILURE;
		goto close_socket;
	}

	err = cio_eventloop_run(&loop);
	if (err != CIO_SUCCESS) {
		ret = EXIT_FAILURE;
	}

close_socket:
	cio_server_socket_close(&server_socket);
destroy_loop:
	cio_eventloop_destroy(&loop);
	return ret;
}